

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  EnvironmentType EVar2;
  PlannerType PVar3;
  int iVar4;
  long lVar5;
  ostream *poVar6;
  ulong uVar7;
  string searchDir;
  string plannerType;
  string environmentType;
  string local_90;
  string local_70;
  string local_50;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    if (((*pcVar1 == '-') && (pcVar1[1] == 'h')) && (pcVar1[2] == '\0')) {
      PrintHelp(argv);
      return 0;
    }
  }
  else if (argc < 2) {
    printf("USAGE: %s [-s] [--env=<env_t>] [--planner=<planner_t>] [--search-dir=<search_t>] <cfg file> [mot prims]\n"
           ,*argv);
    printf("See \'%s -h\' for help.\n",*argv);
    return 2;
  }
  iVar4 = argc + -1;
  lVar5 = 0;
  do {
    if (*argv[lVar5 + 1] != '-') {
      iVar4 = (int)lVar5;
      if (iVar4 == 0) {
        iVar4 = 0;
        goto LAB_00109ddb;
      }
      break;
    }
    lVar5 = lVar5 + 1;
  } while (iVar4 != (int)lVar5);
  uVar7 = 1;
  do {
    pcVar1 = argv[uVar7];
    if (((*pcVar1 == '-') && (pcVar1[1] == 's')) && (pcVar1[2] == '\0')) break;
    uVar7 = uVar7 + 1;
  } while (iVar4 + 1 != uVar7);
LAB_00109ddb:
  CheckEnvironmentType_abi_cxx11_(&local_50,iVar4,argv);
  CheckPlannerType_abi_cxx11_(&local_70,iVar4,argv);
  CheckSearchDirection_abi_cxx11_(&local_90,iVar4,argv);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Environment: ",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; Planner: ",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"; Search direction: ",0x14);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  EVar2 = StrToEnvironmentType(local_50._M_dataplus._M_p);
  PVar3 = StrToPlannerType(local_70._M_dataplus._M_p);
  strcmp(local_90._M_dataplus._M_p,"forward");
  if (EVar2 == INVALID_ENV_TYPE || PVar3 == INVALID_PLANNER_TYPE) {
    printf("USAGE: %s [-s] [--env=<env_t>] [--planner=<planner_t>] [--search-dir=<search_t>] <cfg file> [mot prims]\n"
           ,*argv);
    printf("See \'%s -h\' for help.\n",*argv);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    return 3;
  }
  iVar4 = (*(code *)(&DAT_0010b0c0 + *(int *)(&DAT_0010b0c0 + (ulong)(uint)EVar2 * 4)))();
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
    // Print help
    if (argc == 2 && strcmp(argv[1], "-h") == 0) {
        PrintHelp(argv);
        return MAIN_RESULT_SUCCESS;
    }
    else if (argc < 2) {
        PrintUsage(argv);
        return MAIN_RESULT_INSUFFICIENT_ARGS;
    }

    // Find the number of options passed in; cfg and motprim files come after all options
    // options include any string starting with "-"
    int numOptions = 0;
    for (int i = 1; i < argc; i++) {
        if (strncmp("-", argv[i], 1) == 0) {
            numOptions++;
        }
        else {
            break;
        }
    }

    // Check command line arguments to find environment type and whether or not to
    // use one of the navigating examples.
    bool navigating = CheckIsNavigating(numOptions, argv);
    std::string environmentType = CheckEnvironmentType(numOptions, argv);
    std::string plannerType = CheckPlannerType(numOptions, argv);
    std::string searchDir = CheckSearchDirection(numOptions, argv);

    std::cout << "Environment: " << environmentType << "; Planner: " << plannerType << "; Search direction: "
        << searchDir << std::endl;

    int envArgIdx = numOptions + 1;
    EnvironmentType environment = StrToEnvironmentType(environmentType.c_str());
    PlannerType planner = StrToPlannerType(plannerType.c_str());
    bool forwardSearch = !strcmp(searchDir.c_str(), "forward");

    bool usingMotionPrimitives = (argc == numOptions + 3);
    char* motPrimFilename = usingMotionPrimitives ? argv[envArgIdx + 1] : NULL;

    // make sure we've been given valid a valid environment
    if (environment == INVALID_ENV_TYPE || planner == INVALID_PLANNER_TYPE) {
        PrintUsage(argv);
        return MAIN_RESULT_INCORRECT_OPTIONS;
    }

    // Launch the correct example given the planner and an environment file.
    int plannerRes = 0;
    switch (environment) {
    case ENV_TYPE_2D:
        if (navigating) {
            plannerRes = planandnavigate2d(planner, argv[envArgIdx]);
        }
        else {
            plannerRes = plan2d(planner, argv[envArgIdx], forwardSearch);
        }
        break;
    case ENV_TYPE_2DUU:
        printf("Warning: planning in two dimensions under uncertainty is not fully implemented!\n");
        plannerRes = plan2duu(planner, argv[envArgIdx]);
        break;
    case ENV_TYPE_XYTHETA:
        if (navigating) {
            plannerRes = planandnavigatexythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        else {
            plannerRes = planxythetalat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        }
        break;
    case ENV_TYPE_XYTHETAMLEV:
        plannerRes = planxythetamlevlat(planner, argv[envArgIdx], motPrimFilename, forwardSearch);
        break;
    case ENV_TYPE_ROBARM:
        plannerRes = planrobarm(planner, argv[envArgIdx], forwardSearch);
        break;
    default:
        printf("Unsupported Environment Type...\n");
        PrintUsage(argv);
        return MAIN_RESULT_UNSUPPORTED_ENV;
    }

    return plannerRes == 1 ? MAIN_RESULT_SUCCESS : MAIN_RESULT_FAILURE;
}